

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int archive_read_format_7zip_bid(archive_read *a,int best_bid)

{
  int iVar1;
  int *__s1;
  int in_ESI;
  int step;
  char *buff;
  ssize_t bytes_avail;
  ssize_t window;
  ssize_t offset;
  char *p;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  archive_read *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  ulong local_30;
  long local_28;
  long local_20;
  int local_4;
  
  if (in_ESI < 0x21) {
    __s1 = (int *)__archive_read_ahead
                            (in_stack_ffffffffffffffc0,
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                             (ssize_t *)0x2462f4);
    if (__s1 == (int *)0x0) {
      local_4 = 0;
    }
    else {
      iVar1 = memcmp(__s1,anon_var_dwarf_56351,6);
      if (iVar1 == 0) {
        local_4 = 0x30;
      }
      else if ((((char)*__s1 == 'M') && (*(char *)((long)__s1 + 1) == 'Z')) || (*__s1 == 0x464c457f)
              ) {
        local_28 = 0x27000;
        local_30 = 0x1000;
        do {
          while( true ) {
            if (0x60000 < (long)(local_28 + local_30)) goto LAB_0024644e;
            in_stack_ffffffffffffffc0 =
                 (archive_read *)
                 __archive_read_ahead
                           (in_stack_ffffffffffffffc0,
                            CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                            (ssize_t *)0x2463ab);
            if (in_stack_ffffffffffffffc0 == (archive_read *)0x0) break;
            for (local_20 = (long)&(in_stack_ffffffffffffffc0->archive).magic + local_28;
                (char *)(local_20 + 0x20U) <
                in_stack_ffffffffffffffc8 + (long)&in_stack_ffffffffffffffc0->archive;
                local_20 = local_20 + in_stack_ffffffffffffffbc) {
              in_stack_ffffffffffffffbc = check_7zip_header_in_sfx(in_stack_ffffffffffffffc8);
              if (in_stack_ffffffffffffffbc == 0) {
                return 0x30;
              }
            }
            local_28 = local_20 - (long)in_stack_ffffffffffffffc0;
          }
          local_30 = (long)local_30 >> 1;
        } while (0x3f < local_30);
        local_4 = 0;
      }
      else {
LAB_0024644e:
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int
archive_read_format_7zip_bid(struct archive_read *a, int best_bid)
{
	const char *p;

	/* If someone has already bid more than 32, then avoid
	   trashing the look-ahead buffers with a seek. */
	if (best_bid > 32)
		return (-1);

	if ((p = __archive_read_ahead(a, 6, NULL)) == NULL)
		return (0);

	/* If first six bytes are the 7-Zip signature,
	 * return the bid right now. */
	if (memcmp(p, _7ZIP_SIGNATURE, 6) == 0)
		return (48);

	/*
	 * It may a 7-Zip SFX archive file. If first two bytes are
	 * 'M' and 'Z' available on Windows or first four bytes are
	 * "\x7F\x45LF" available on posix like system, seek the 7-Zip
	 * signature. Although we will perform a seek when reading
	 * a header, what we do not use __archive_read_seek() here is
	 * due to a bidding performance.
	 */
	if ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0) {
		ssize_t offset = SFX_MIN_ADDR;
		ssize_t window = 4096;
		ssize_t bytes_avail;
		while (offset + window <= (SFX_MAX_ADDR)) {
			const char *buff = __archive_read_ahead(a,
					offset + window, &bytes_avail);
			if (buff == NULL) {
				/* Remaining bytes are less than window. */
				window >>= 1;
				if (window < 0x40)
					return (0);
				continue;
			}
			p = buff + offset;
			while (p + 32 < buff + bytes_avail) {
				int step = check_7zip_header_in_sfx(p);
				if (step == 0)
					return (48);
				p += step;
			}
			offset = p - buff;
		}
	}
	return (0);
}